

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O0

lzma_ret lzma2_encode(lzma_coder_conflict7 *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                     size_t out_size)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t uVar3;
  uint uVar4;
  lzma_ret lVar5;
  uint32_t local_4c;
  uint32_t limit;
  uint32_t left;
  lzma_ret ret;
  uint32_t read_start;
  lzma_ret ret_;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_mf *mf_local;
  lzma_coder_conflict7 *coder_local;
  
  do {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    switch(coder->sequence) {
    case SEQ_INDICATOR:
      uVar3 = mf_unencoded(mf);
      if (uVar3 == 0) {
        if (mf->action == LZMA_FINISH) {
          sVar2 = *out_pos;
          *out_pos = sVar2 + 1;
          out[sVar2] = '\0';
        }
        return (uint)(mf->action != LZMA_RUN);
      }
      if (((coder->need_state_reset & 1U) != 0) &&
         (lVar5 = lzma_lzma_encoder_reset((lzma_coder_conflict9 *)coder->lzma,&coder->opt_cur),
         lVar5 != LZMA_OK)) {
        return lVar5;
      }
      coder->uncompressed_size = 0;
      coder->compressed_size = 0;
      coder->sequence = SEQ_BLOCK_HEADER;
    case SEQ_BLOCK_HEADER:
      uVar4 = 0x200000 - (int)coder->uncompressed_size;
      if (uVar4 < mf->match_len_max) {
        local_4c = 0;
      }
      else {
        local_4c = ((mf->read_pos - mf->read_ahead) + uVar4) - mf->match_len_max;
      }
      uVar3 = mf->read_pos;
      uVar1 = mf->read_ahead;
      lVar5 = lzma_lzma_encode((lzma_coder_conflict9 *)coder->lzma,mf,coder->buf + 6,
                               &coder->compressed_size,0x10000,local_4c);
      coder->uncompressed_size =
           (ulong)((mf->read_pos - mf->read_ahead) - (uVar3 - uVar1)) + coder->uncompressed_size;
      if (0x10000 < coder->compressed_size) {
        __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,200,
                      "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (0x200000 < coder->uncompressed_size) {
        __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,0xc9,
                      "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (lVar5 != LZMA_STREAM_END) {
        return LZMA_OK;
      }
      if (coder->compressed_size < coder->uncompressed_size) {
        lzma2_header_lzma(coder);
        coder->sequence = SEQ_BLOCK;
switchD_00831d73_caseD_2:
        lzma_bufcpy(coder->buf,&coder->buf_pos,coder->compressed_size,out,out_pos,out_size);
        if (coder->buf_pos != coder->compressed_size) {
          return LZMA_OK;
        }
        coder->sequence = SEQ_INDICATOR;
      }
      else {
        coder->uncompressed_size = (ulong)mf->read_ahead + coder->uncompressed_size;
        if (0x200000 < coder->uncompressed_size) {
          __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                        ,0xd4,
                        "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        mf->read_ahead = 0;
        lzma2_header_uncompressed(coder);
        coder->need_state_reset = true;
        coder->sequence = SEQ_CODER_INIT;
      }
      break;
    case SEQ_BLOCK:
      goto switchD_00831d73_caseD_2;
    case SEQ_CODER_INIT:
      lzma_bufcpy(coder->buf,&coder->buf_pos,3,out,out_pos,out_size);
      if (coder->buf_pos != 3) {
        return LZMA_OK;
      }
      coder->sequence = SEQ_CODE;
    case SEQ_CODE:
      mf_read(mf,out,out_pos,out_size,&coder->uncompressed_size);
      if (coder->uncompressed_size != 0) {
        return LZMA_OK;
      }
      coder->sequence = SEQ_INDICATOR;
    }
  } while( true );
}

Assistant:

static lzma_ret
lzma2_encode(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size)
{
	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_INIT:
		// If there's no input left and we are flushing or finishing,
		// don't start a new chunk.
		if (mf_unencoded(mf) == 0) {
			// Write end of payload marker if finishing.
			if (mf->action == LZMA_FINISH)
				out[(*out_pos)++] = 0;

			return mf->action == LZMA_RUN
					? LZMA_OK : LZMA_STREAM_END;
		}

		if (coder->need_state_reset)
			return_if_error(lzma_lzma_encoder_reset(
					coder->lzma, &coder->opt_cur));

		coder->uncompressed_size = 0;
		coder->compressed_size = 0;
		coder->sequence = SEQ_LZMA_ENCODE;

	// Fall through

	case SEQ_LZMA_ENCODE: {
		uint32_t read_start;
		lzma_ret ret;

		// Calculate how much more uncompressed data this chunk
		// could accept.
		const uint32_t left = LZMA2_UNCOMPRESSED_MAX
				- coder->uncompressed_size;
		uint32_t limit;

		if (left < mf->match_len_max) {
			// Must flush immediately since the next LZMA symbol
			// could make the uncompressed size of the chunk too
			// big.
			limit = 0;
		} else {
			// Calculate maximum read_limit that is OK from point
			// of view of LZMA2 chunk size.
			limit = mf->read_pos - mf->read_ahead
					+ left - mf->match_len_max;
		}

		// Save the start position so that we can update
		// coder->uncompressed_size.
		read_start = mf->read_pos - mf->read_ahead;

		// Call the LZMA encoder until the chunk is finished.
		ret = lzma_lzma_encode(coder->lzma, mf,
				coder->buf + LZMA2_HEADER_MAX,
				&coder->compressed_size,
				LZMA2_CHUNK_MAX, limit);

		coder->uncompressed_size += mf->read_pos - mf->read_ahead
				- read_start;

		assert(coder->compressed_size <= LZMA2_CHUNK_MAX);
		assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);

		if (ret != LZMA_STREAM_END)
			return LZMA_OK;

		// See if the chunk compressed. If it didn't, we encode it
		// as uncompressed chunk. This saves a few bytes of space
		// and makes decoding faster.
		if (coder->compressed_size >= coder->uncompressed_size) {
			coder->uncompressed_size += mf->read_ahead;
			assert(coder->uncompressed_size
					<= LZMA2_UNCOMPRESSED_MAX);
			mf->read_ahead = 0;
			lzma2_header_uncompressed(coder);
			coder->need_state_reset = true;
			coder->sequence = SEQ_UNCOMPRESSED_HEADER;
			break;
		}

		// The chunk did compress at least by one byte, so we store
		// the chunk as LZMA.
		lzma2_header_lzma(coder);

		coder->sequence = SEQ_LZMA_COPY;
	}

	// Fall through

	case SEQ_LZMA_COPY:
		// Copy the compressed chunk along its headers to the
		// output buffer.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				coder->compressed_size,
				out, out_pos, out_size);
		if (coder->buf_pos != coder->compressed_size)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;

	case SEQ_UNCOMPRESSED_HEADER:
		// Copy the three-byte header to indicate uncompressed chunk.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				LZMA2_HEADER_UNCOMPRESSED,
				out, out_pos, out_size);
		if (coder->buf_pos != LZMA2_HEADER_UNCOMPRESSED)
			return LZMA_OK;

		coder->sequence = SEQ_UNCOMPRESSED_COPY;

	// Fall through

	case SEQ_UNCOMPRESSED_COPY:
		// Copy the uncompressed data as is from the dictionary
		// to the output buffer.
		mf_read(mf, out, out_pos, out_size, &coder->uncompressed_size);
		if (coder->uncompressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;
	}

	return LZMA_OK;
}